

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_> *
gurkenlaeufer::getScenarios_abi_cxx11_(void)

{
  tuple<gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
  this;
  list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_> *in_RDI;
  allocator local_61;
  __uniq_ptr_impl<gurkenlaeufer::IParserStateFactory,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
  local_60;
  Parser parser;
  shared_ptr<gurkenlaeufer::ScenarioCollection> scenarios;
  string local_38;
  
  std::make_shared<gurkenlaeufer::ScenarioCollection>();
  this.
  super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
  .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        )operator_new(0x18);
  std::__shared_ptr<gurkenlaeufer::IScenarioCollection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<gurkenlaeufer::ScenarioCollection,void>
            ((__shared_ptr<gurkenlaeufer::IScenarioCollection,(__gnu_cxx::_Lock_policy)2> *)
             &local_38,
             &scenarios.
              super___shared_ptr<gurkenlaeufer::ScenarioCollection,_(__gnu_cxx::_Lock_policy)2>);
  ParserStateFactory::ParserStateFactory
            ((ParserStateFactory *)
             this.
             super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
             .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl,
             (IScenarioCollectionSPtr *)&local_38);
  local_60._M_t.
  super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
  .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl =
       (tuple<gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        )(tuple<gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
          )this.
           super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
           .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl;
  Parser::Parser(&parser,(IParserStateFactoryPtr *)&local_60);
  if ((_Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
       )local_60._M_t.
        super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl !=
      (IParserStateFactory *)0x0) {
    (**(code **)(*(long *)local_60._M_t.
                          super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
                          .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>.
                          _M_head_impl + 8))();
  }
  local_60._M_t.
  super__Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
  .super__Head_base<0UL,_gurkenlaeufer::IParserStateFactory_*,_false>._M_head_impl =
       (tuple<gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
        )(_Tuple_impl<0UL,_gurkenlaeufer::IParserStateFactory_*,_std::default_delete<gurkenlaeufer::IParserStateFactory>_>
          )0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_string_length);
  std::__cxx11::string::string((string *)&local_38,"addition.feature",&local_61);
  Parser::parseFile(&parser,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  Parser::finish(&parser);
  std::__cxx11::list<gurkenlaeufer::Scenario,_std::allocator<gurkenlaeufer::Scenario>_>::list
            (in_RDI,&(scenarios.
                      super___shared_ptr<gurkenlaeufer::ScenarioCollection,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->_scenarios);
  Parser::~Parser(&parser);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&scenarios.
              super___shared_ptr<gurkenlaeufer::ScenarioCollection,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return in_RDI;
}

Assistant:

std::list<gurkenlaeufer::Scenario> gurkenlaeufer::getScenarios()
{
    auto scenarios = std::make_shared<gurkenlaeufer::ScenarioCollection>();

    Parser parser(IParserStateFactoryPtr(new gurkenlaeufer::ParserStateFactory(scenarios)));
    parser.parseFile("addition.feature");
    parser.finish();

    return scenarios->getScenarios();
}